

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa_compressor.h
# Opt level: O1

exr_result_t DwaCompressor_compress(DwaCompressor *me)

{
  uint64_t *encbytes;
  Classifier *pCVar1;
  uint8_t uVar2;
  int iVar3;
  CompressorScheme CVar4;
  undefined8 *__s;
  undefined8 *puVar5;
  char *pcVar6;
  ChannelData *pCVar7;
  CscChannelSet *pCVar8;
  exr_coding_channel_info_t *peVar9;
  uint8_t *puVar10;
  void *in;
  undefined1 auVar11 [16];
  exr_result_t eVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  char *pcVar16;
  size_t sVar17;
  ulong uVar18;
  size_t out_bytes_avail;
  size_t sVar19;
  uint64_t uVar20;
  size_t sVar21;
  int *piVar22;
  unsigned_short *toNonlinear;
  exr_encode_pipeline_t *peVar23;
  ulong uVar24;
  long lVar25;
  ulong uVar26;
  uint8_t *puVar27;
  char *__s1;
  long lVar28;
  bool bVar29;
  bool bVar30;
  int iVar32;
  undefined1 auVar31 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  size_t readHere;
  LossyDctEncoder enc;
  ulong local_2e0;
  undefined8 *local_2c8;
  uint8_t *local_2b0;
  uint8_t *local_2a8;
  ulong local_298;
  size_t local_288;
  LossyDctEncoder local_280;
  
  me->_channelRules = sDefaultChannelRules;
  me->_channelRuleCount = 0xf;
  local_288 = 0;
  DwaCompressor_initializeBuffers(me,&local_288);
  sVar21 = local_288;
  peVar23 = me->_encode;
  if (0x57 < peVar23->compressed_alloc_size) {
    eVar12 = internal_encode_alloc_buffer
                       (peVar23,EXR_TRANSCODE_BUFFER_SCRATCH1,&peVar23->compressed_buffer,
                        &peVar23->compressed_alloc_size,local_288);
    if (eVar12 != 0) {
      return eVar12;
    }
    __s = (undefined8 *)me->_encode->compressed_buffer;
    bVar29 = false;
    memset(__s,0,me->_encode->compressed_alloc_size);
    local_2c8 = __s + 0xb;
    local_298 = 0x58;
    if (1 < sVar21) {
      local_2a8 = (uint8_t *)((long)__s + 0x5a);
      bVar30 = me->_channelRuleCount == 0;
      bVar29 = !bVar30;
      if (bVar30) {
        local_2b0 = (uint8_t *)0x2;
      }
      else {
        local_2b0 = (uint8_t *)0x2;
        bVar29 = true;
        uVar24 = 0;
        do {
          if (me->_numChannels == 0) {
            bVar30 = true;
          }
          else {
            local_2e0 = uVar24 * 3;
            lVar25 = 0;
            uVar26 = 0;
            do {
              puVar5 = *(undefined8 **)
                        ((long)(me->_channelData->_dctData)._dctData + lVar25 + -0x20);
              pcVar6 = (char *)*puVar5;
              pcVar16 = strrchr(pcVar6,0x2e);
              __s1 = pcVar16 + 1;
              if (pcVar16 == (char *)0x0) {
                __s1 = pcVar6;
              }
              pCVar1 = me->_channelRules + uVar24;
              iVar32 = 0;
              bVar30 = false;
              if (pCVar1->_type == (uint)*(ushort *)((long)puVar5 + 0x1a)) {
                if (pCVar1->_caseInsensitive == '\0') {
                  iVar13 = strcmp(__s1,pCVar1->_suffix);
                }
                else {
                  iVar13 = strcasecmp(__s1,pCVar1->_suffix);
                }
                bVar30 = iVar13 == 0;
              }
              if (bVar30) {
                pcVar6 = pCVar1->_suffix;
                sVar17 = strlen(pcVar6);
                uVar18 = (long)local_2b0 + sVar17 + 3;
                if (sVar21 < uVar18) {
                  iVar32 = 1;
                }
                else {
                  memcpy(local_2a8,pcVar6,sVar17 + 1);
                  *(byte *)((long)local_2a8 + sVar17 + 1) =
                       ((char)(pCVar1->_cscIdx << 4) + ((byte)pCVar1->_scheme & 3) * '\x04' |
                       pCVar1->_caseInsensitive & 1) + 0x10;
                  *(char *)((long)local_2a8 + sVar17 + 2) = (char)pCVar1->_type;
                  local_2a8 = (uint8_t *)((long)local_2a8 + sVar17 + 3);
                  iVar32 = 5;
                  local_2b0 = (uint8_t *)uVar18;
                }
              }
              if (bVar30) goto LAB_00109cf7;
              uVar26 = uVar26 + 1;
              lVar25 = lVar25 + 0x240;
            } while (uVar26 < (ulong)(long)me->_numChannels);
            iVar32 = 5;
LAB_00109cf7:
            bVar30 = iVar32 == 5;
          }
          if (!bVar30) break;
          uVar24 = uVar24 + 1;
          bVar29 = uVar24 < me->_channelRuleCount;
        } while (bVar29);
      }
      if (bVar29) {
        bVar29 = false;
      }
      else {
        *(short *)local_2c8 = (short)local_2b0;
        local_298 = (long)local_2b0 + 0x58;
        bVar29 = true;
        local_2c8 = (undefined8 *)local_2a8;
      }
    }
    if (bVar29) {
      if (me->_encode->compressed_alloc_size <= local_298) {
        return 1;
      }
      local_2b0 = me->_packedAcBuffer;
      local_2a8 = me->_packedDcBuffer;
      *__s = 2;
      __s[10] = (ulong)me->_acCompression;
      DwaCompressor_setupChannelData(me);
      auVar11 = _DAT_0012c0e0;
      lVar25 = (long)me->_numChannels;
      if (lVar25 != 0) {
        uVar24 = lVar25 + 3U & 0xfffffffffffffffc;
        lVar25 = lVar25 + -1;
        auVar31._8_4_ = (int)lVar25;
        auVar31._0_8_ = lVar25;
        auVar31._12_4_ = (int)((ulong)lVar25 >> 0x20);
        piVar22 = &me->_channelData[3].processed;
        auVar31 = auVar31 ^ _DAT_0012c0e0;
        auVar33 = _DAT_0012c0b0;
        auVar34 = _DAT_0012c0c0;
        do {
          auVar35 = auVar34 ^ auVar11;
          iVar32 = auVar31._4_4_;
          if ((bool)(~(auVar35._4_4_ == iVar32 && auVar31._0_4_ < auVar35._0_4_ ||
                      iVar32 < auVar35._4_4_) & 1)) {
            piVar22[-0x1b0] = 0;
          }
          if ((auVar35._12_4_ != auVar31._12_4_ || auVar35._8_4_ <= auVar31._8_4_) &&
              auVar35._12_4_ <= auVar31._12_4_) {
            piVar22[-0x120] = 0;
          }
          auVar35 = auVar33 ^ auVar11;
          iVar13 = auVar35._4_4_;
          if (iVar13 <= iVar32 && (iVar13 != iVar32 || auVar35._0_4_ <= auVar31._0_4_)) {
            piVar22[-0x90] = 0;
            *piVar22 = 0;
          }
          lVar25 = auVar34._8_8_;
          auVar34._0_8_ = auVar34._0_8_ + 4;
          auVar34._8_8_ = lVar25 + 4;
          lVar25 = auVar33._8_8_;
          auVar33._0_8_ = auVar33._0_8_ + 4;
          auVar33._8_8_ = lVar25 + 4;
          piVar22 = piVar22 + 0x240;
          uVar24 = uVar24 - 4;
        } while (uVar24 != 0);
      }
      iVar32 = me->_min[1];
      bVar29 = me->_max[1] < iVar32;
      if (me->_max[1] < iVar32) {
        uVar14 = 0;
      }
      else {
        puVar27 = (uint8_t *)me->_encode->packed_buffer;
        uVar14 = 0;
        do {
          bVar30 = me->_numChannels != 0;
          if (bVar30) {
            lVar25 = 0x20;
            uVar24 = 0;
            do {
              lVar28 = *(long *)((long)(me->_channelData->_dctData)._dctData + lVar25 + -0x40);
              iVar13 = 10;
              if (iVar32 % *(int *)(lVar28 + 0x14) == 0) {
                uVar14 = DctCoderChannelData_push_row
                                   ((DctCoderChannelData *)
                                    ((long)(me->_channelData->_dctData)._dctData + lVar25 + -0x20),
                                    puVar27);
                if (uVar14 == 0) {
                  puVar27 = puVar27 + (long)*(char *)(lVar28 + 0x19) * (long)*(int *)(lVar28 + 0xc);
                  iVar13 = 0;
                  uVar14 = 0;
                }
                else {
                  iVar13 = 1;
                  local_2e0 = (ulong)uVar14;
                }
              }
              if ((iVar13 != 10) && (iVar13 != 0)) break;
              uVar24 = uVar24 + 1;
              lVar25 = lVar25 + 0x240;
              bVar30 = uVar24 < (ulong)(long)me->_numChannels;
            } while (bVar30);
          }
          if (bVar30) break;
          bVar29 = me->_max[1] <= iVar32;
          bVar30 = iVar32 < me->_max[1];
          iVar32 = iVar32 + 1;
        } while (bVar30);
      }
      if (!bVar29) {
        return (uint)local_2e0;
      }
      bVar29 = me->_numCscChannelSets != 0;
      if (bVar29) {
        lVar25 = 8;
        uVar24 = 0;
        do {
          pCVar7 = me->_channelData;
          pCVar8 = me->_cscChannelSets;
          iVar32 = *(int *)((long)pCVar8->idx + lVar25 + -8);
          iVar13 = *(int *)((long)pCVar8->idx + lVar25 + -4);
          iVar3 = *(int *)((long)pCVar8->idx + lVar25);
          peVar9 = pCVar7[iVar32].chan;
          LossyDctEncoder_base_construct
                    (&local_280,me->_dwaCompressionLevel / 100000.0,local_2b0,local_2a8,
                     dwaCompressorToNonlinear,peVar9->width,peVar9->height);
          local_280._channel_encode_data_count = 3;
          local_280._channel_encode_data[0] = &pCVar7[iVar32]._dctData;
          local_280._channel_encode_data[1] = &pCVar7[iVar13]._dctData;
          local_280._channel_encode_data[2] = &pCVar7[iVar3]._dctData;
          uVar14 = LossyDctEncoder_execute(&local_280);
          __s[8] = __s[8] + (long)local_280._numAcComp;
          __s[9] = __s[9] + (long)local_280._numDcComp;
          local_2b0 = local_2b0 + (long)local_280._numAcComp * 2;
          local_2a8 = local_2a8 + (long)local_280._numDcComp * 2;
          pCVar7 = me->_channelData;
          pCVar7[*(int *)((long)pCVar8->idx + lVar25 + -8)].processed = 1;
          pCVar7[*(int *)((long)pCVar8->idx + lVar25 + -4)].processed = 1;
          pCVar7[*(int *)((long)pCVar8->idx + lVar25)].processed = 1;
          if (uVar14 != 0) {
            local_2e0._0_4_ = 1;
          }
          local_2e0 = (ulong)(uint)local_2e0;
          if (uVar14 != 0) break;
          uVar24 = uVar24 + 1;
          lVar25 = lVar25 + 0xc;
          bVar29 = uVar24 < (ulong)(long)me->_numCscChannelSets;
        } while (bVar29);
      }
      if (bVar29) {
        return (uint)local_2e0;
      }
      bVar29 = me->_numChannels != 0;
      if (bVar29) {
        lVar25 = 0x210;
        uVar24 = 0;
        do {
          pCVar7 = me->_channelData;
          bVar30 = false;
          if (pCVar7[uVar24].processed != 0) goto LAB_0010a35c;
          peVar9 = pCVar7[uVar24].chan;
          CVar4 = pCVar7[uVar24].compression;
          if (CVar4 == UNKNOWN) {
            if (pCVar7[uVar24]._dctData._size != 0) {
              sVar17 = (long)peVar9->bytes_per_element * (long)peVar9->width;
              uVar26 = 0;
              do {
                memcpy(pCVar7[uVar24].planarUncBufferEnd,pCVar7[uVar24]._dctData._rows[uVar26],
                       sVar17);
                pCVar7[uVar24].planarUncBufferEnd = pCVar7[uVar24].planarUncBufferEnd + sVar17;
                uVar26 = uVar26 + 1;
              } while (uVar26 < pCVar7[uVar24]._dctData._size);
            }
            __s[1] = __s[1] + pCVar7[uVar24].planarUncSize;
LAB_0010a353:
            pCVar7[uVar24].processed = 1;
            bVar30 = false;
          }
          else {
            bVar30 = true;
            if (CVar4 == LOSSY_DCT) {
              toNonlinear = (uint16_t *)0x0;
              if (peVar9->p_linear == '\0') {
                toNonlinear = dwaCompressorToNonlinear;
              }
              LossyDctEncoder_base_construct
                        (&local_280,me->_dwaCompressionLevel / 100000.0,local_2b0,local_2a8,
                         toNonlinear,peVar9->width,peVar9->height);
              local_280._channel_encode_data_count = 1;
              local_280._channel_encode_data[0] = &pCVar7[uVar24]._dctData;
              uVar14 = LossyDctEncoder_execute(&local_280);
              __s[8] = __s[8] + (long)local_280._numAcComp;
              __s[9] = __s[9] + (long)local_280._numDcComp;
              local_2b0 = local_2b0 + (long)local_280._numAcComp * 2;
              local_2a8 = local_2a8 + (long)local_280._numDcComp * 2;
              if (uVar14 != 0) {
                local_2e0._0_4_ = uVar14;
              }
              local_2e0 = (ulong)(uint)local_2e0;
              if (uVar14 == 0) goto LAB_0010a353;
            }
            else {
              if (CVar4 == RLE) {
                if (pCVar7[uVar24]._dctData._size != 0) {
                  uVar26 = 0;
                  do {
                    iVar32 = peVar9->width;
                    if (0 < iVar32) {
                      puVar27 = pCVar7[uVar24]._dctData._rows[uVar26];
                      iVar13 = 0;
                      do {
                        if ('\0' < peVar9->bytes_per_element) {
                          lVar28 = 0;
                          do {
                            uVar2 = puVar27[lVar28];
                            puVar10 = *(uint8_t **)
                                       ((long)(pCVar7->_dctData)._dctData +
                                       lVar28 * 8 + lVar25 + -0x20);
                            *(uint8_t **)
                             ((long)(pCVar7->_dctData)._dctData + lVar28 * 8 + lVar25 + -0x20) =
                                 puVar10 + 1;
                            *puVar10 = uVar2;
                            lVar28 = lVar28 + 1;
                          } while (lVar28 < peVar9->bytes_per_element);
                          puVar27 = puVar27 + lVar28;
                        }
                        iVar13 = iVar13 + 1;
                        iVar32 = peVar9->width;
                      } while (iVar13 < iVar32);
                    }
                    __s[7] = __s[7] + (long)iVar32 * (long)peVar9->bytes_per_element;
                    uVar26 = uVar26 + 1;
                  } while (uVar26 < pCVar7[uVar24]._dctData._size);
                }
                goto LAB_0010a353;
              }
              local_2e0 = 3;
            }
          }
LAB_0010a35c:
          if (bVar30) break;
          uVar24 = uVar24 + 1;
          lVar25 = lVar25 + 0x240;
          bVar29 = uVar24 < (ulong)(long)me->_numChannels;
        } while (bVar29);
      }
      if (bVar29) {
        return (uint)local_2e0;
      }
      sVar19 = __s[1];
      if (sVar19 != 0) {
        puVar27 = me->_planarUncBuffer[0];
        out_bytes_avail = exr_compress_max_buffer_size(sVar19);
        eVar12 = exr_compress_buffer(9,puVar27,sVar19,local_2c8,out_bytes_avail,(size_t *)&local_280
                                    );
        if (eVar12 != 0) {
          return eVar12;
        }
        local_2c8 = (undefined8 *)((long)local_2c8 + local_280._0_8_);
        __s[2] = local_280._0_8_;
        local_298 = local_298 + local_280._0_8_;
        uVar14 = 0;
      }
      uVar20 = __s[8];
      if (uVar20 != 0) {
        encbytes = __s + 3;
        if (me->_acCompression == DEFLATE) {
          puVar27 = me->_packedAcBuffer;
          sVar21 = exr_compress_max_buffer_size(uVar20 * 2);
          uVar14 = exr_compress_buffer(9,puVar27,uVar20 * 2,local_2c8,sVar21,(size_t *)&local_280);
          uVar15 = uVar14;
          if (uVar14 == 0) {
            *encbytes = local_280._0_8_;
            uVar15 = (uint)local_2e0;
          }
        }
        else {
          if (me->_acCompression != STATIC_HUFFMAN) {
            return 3;
          }
          uVar14 = internal_huf_compress
                             (encbytes,local_2c8,(long)__s + (sVar21 - (long)local_2c8),
                              (uint16_t *)me->_packedAcBuffer,uVar20,me->_encode->scratch_buffer_1,
                              me->_encode->scratch_alloc_size_1);
          uVar15 = (uint)local_2e0;
          if ((uVar14 != 0) && (uVar15 = uVar14, uVar14 == 4)) {
            peVar23 = me->_encode;
            memcpy(peVar23->compressed_buffer,peVar23->packed_buffer,peVar23->packed_alloc_size);
            me->_encode->compressed_bytes = me->_encode->packed_alloc_size;
            uVar15 = 0;
          }
        }
        if (uVar14 != 0) {
          return uVar15;
        }
        local_2c8 = (undefined8 *)((long)local_2c8 + *encbytes);
        local_298 = local_298 + *encbytes;
        uVar14 = 0;
        local_2e0._0_4_ = uVar15;
      }
      if (__s[9] != 0) {
        sVar21 = __s[9] * 2;
        peVar23 = me->_encode;
        uVar14 = internal_encode_alloc_buffer
                           (peVar23,EXR_TRANSCODE_BUFFER_SCRATCH1,&peVar23->scratch_buffer_1,
                            &peVar23->scratch_alloc_size_1,sVar21);
        if (uVar14 == 0) {
          internal_zip_deconstruct_bytes
                    ((uint8_t *)me->_encode->scratch_buffer_1,me->_packedDcBuffer,sVar21);
          iVar32 = me->_zipLevel;
          in = me->_encode->scratch_buffer_1;
          sVar19 = exr_compress_max_buffer_size(sVar21);
          uVar15 = exr_compress_buffer(iVar32,in,sVar21,local_2c8,sVar19,(size_t *)&local_280);
          uVar14 = 0;
          if (uVar15 == 0) {
            __s[4] = local_280._0_8_;
            local_2c8 = (undefined8 *)((long)local_2c8 + local_280._0_8_);
            local_298 = local_298 + local_280._0_8_;
            bVar29 = true;
          }
          else {
            bVar29 = false;
            local_2e0._0_4_ = uVar15;
            uVar14 = uVar15;
          }
        }
        else {
          bVar29 = false;
          local_2e0._0_4_ = uVar14;
        }
        if (!bVar29) {
          return (uint)local_2e0;
        }
      }
      if (__s[7] != 0) {
        uVar20 = internal_rle_compress
                           (me->_rleBuffer,me->_rleBufferSize,me->_planarUncBuffer[2],__s[7]);
        __s[6] = uVar20;
        puVar27 = me->_rleBuffer;
        sVar21 = exr_compress_max_buffer_size(uVar20);
        eVar12 = exr_compress_buffer(9,puVar27,uVar20,local_2c8,sVar21,(size_t *)&local_280);
        if (eVar12 != 0) {
          return eVar12;
        }
        __s[5] = local_280._0_8_;
        local_2c8 = (undefined8 *)((long)local_2c8 + local_280._0_8_);
        local_298 = local_298 + local_280._0_8_;
        uVar14 = 0;
      }
      peVar23 = me->_encode;
      if (local_298 != (long)local_2c8 - (long)peVar23->compressed_buffer) {
        return 0x17;
      }
      if (peVar23->packed_bytes <= local_298) {
        memcpy(peVar23->compressed_buffer,peVar23->packed_buffer,peVar23->packed_bytes);
        peVar23 = me->_encode;
        local_298 = peVar23->packed_bytes;
      }
      peVar23->compressed_bytes = local_298;
      return uVar14;
    }
  }
  return 1;
}

Assistant:

exr_result_t
DwaCompressor_compress (DwaCompressor* me)
{
    exr_result_t rv;
    uint8_t*     outPtr;
    uint64_t     outBufferSize = 0;
    uint64_t     nWritten      = 0;
    uint64_t     nAvail;
    int          fileVersion = 2;

    // Starting with 2, we write the channel
    // classification rules into the file
    if (fileVersion < 2)
    {
        me->_channelRules = sLegacyChannelRules;
        me->_channelRuleCount =
            sizeof (sLegacyChannelRules) / sizeof (Classifier);
    }
    else
    {
        me->_channelRules = sDefaultChannelRules;
        me->_channelRuleCount =
            sizeof (sDefaultChannelRules) / sizeof (Classifier);
    }

    size_t readHere = 0;
    rv = DwaCompressor_initializeBuffers (me, &readHere);
    outBufferSize = readHere;

    nAvail = me->_encode->compressed_alloc_size;
    if (nAvail < (NUM_SIZES_SINGLE * sizeof (uint64_t)))
        return EXR_ERR_OUT_OF_MEMORY;

    rv = internal_encode_alloc_buffer (
        me->_encode,
        EXR_TRANSCODE_BUFFER_SCRATCH1,
        &(me->_encode->compressed_buffer),
        &(me->_encode->compressed_alloc_size),
        outBufferSize);
    if (rv != EXR_ERR_SUCCESS) return rv;

    nAvail          = outBufferSize;
    uint64_t* sizes = (uint64_t*) me->_encode->compressed_buffer;

    //
    // Zero all the numbers in the chunk header
    //
    //    memset (sizes, 0, NUM_SIZES_SINGLE * sizeof (uint64_t));
    memset (sizes, 0, me->_encode->compressed_alloc_size);

#define OBIDX(x) (uint64_t*) (sizes + x)

    uint64_t* version                 = OBIDX (VERSION);
    uint64_t* unknownUncompressedSize = OBIDX (UNKNOWN_UNCOMPRESSED_SIZE);
    uint64_t* unknownCompressedSize   = OBIDX (UNKNOWN_COMPRESSED_SIZE);
    uint64_t* acCompressedSize        = OBIDX (AC_COMPRESSED_SIZE);
    uint64_t* dcCompressedSize        = OBIDX (DC_COMPRESSED_SIZE);
    uint64_t* rleCompressedSize       = OBIDX (RLE_COMPRESSED_SIZE);
    uint64_t* rleUncompressedSize     = OBIDX (RLE_UNCOMPRESSED_SIZE);
    uint64_t* rleRawSize              = OBIDX (RLE_RAW_SIZE);

    uint64_t* totalAcUncompressedCount = OBIDX (AC_UNCOMPRESSED_COUNT);
    uint64_t* totalDcUncompressedCount = OBIDX (DC_UNCOMPRESSED_COUNT);

    uint64_t* acCompression = OBIDX (AC_COMPRESSION);
    uint8_t*  packedAcEnd   = NULL;
    uint8_t*  packedDcEnd   = NULL;

    // Now write in the channel rules...
    outPtr = (uint8_t*) (sizes + NUM_SIZES_SINGLE);
    if (rv == EXR_ERR_SUCCESS && fileVersion >= 2)
    {
        rv = DwaCompressor_writeRelevantChannelRules (
            me, &outPtr, nAvail, &nWritten);
    }

    // post add this so we have a 0 value for the relevant channel
    // rules to fill up
    nWritten += NUM_SIZES_SINGLE * sizeof (uint64_t);

    if (rv != EXR_ERR_SUCCESS || nWritten >= me->_encode->compressed_alloc_size)
        return EXR_ERR_OUT_OF_MEMORY;

    uint8_t* outDataPtr   = outPtr;

    //
    // We might not be dealing with any color data, in which
    // case the AC buffer size will be 0, and dereferencing
    // a vector will not be a good thing to do.
    //

    if (me->_packedAcBuffer) packedAcEnd = me->_packedAcBuffer;
    if (me->_packedDcBuffer) packedDcEnd = me->_packedDcBuffer;

    //
    // Setup the AC compression strategy and the version in the data block,
    // then write the relevant channel classification rules if needed
    //
    *version       = fileVersion;
    *acCompression = me->_acCompression;

    rv = DwaCompressor_setupChannelData (me);
    if (rv != EXR_ERR_SUCCESS) return rv;

    //
    // Determine the start of each row in the input buffer
    // Channels are interleaved by scanline
    //
    for (size_t c = 0; c < me->_numChannels; ++c)
    {
        me->_channelData[c].processed = 0;
    }

    uint8_t* inDataPtr = (uint8_t*) me->_encode->packed_buffer;

    for (int y = me->_min[1]; y <= me->_max[1]; ++y)
    {
        for (size_t c = 0; c < me->_numChannels; ++c)
        {
            ChannelData*               cd   = &(me->_channelData[c]);
            exr_coding_channel_info_t* chan = cd->chan;

            if ((y % chan->y_samples) != 0) continue;

            rv = DctCoderChannelData_push_row (&(cd->_dctData), inDataPtr);
            if (rv != EXR_ERR_SUCCESS) return rv;

            inDataPtr += chan->width * chan->bytes_per_element;
        }
    }

    //
    // Make a pass over all our CSC sets and try to encode them first
    //

    for (size_t csc = 0; csc < me->_numCscChannelSets; ++csc)
    {
        LossyDctEncoder enc;
        CscChannelSet*  cset = &(me->_cscChannelSets[csc]);

        rv = LossyDctEncoderCsc_construct (
            &enc,
            me->_dwaCompressionLevel / 100000.f,
            &(me->_channelData[cset->idx[0]]._dctData),
            &(me->_channelData[cset->idx[1]]._dctData),
            &(me->_channelData[cset->idx[2]]._dctData),
            packedAcEnd,
            packedDcEnd,
            dwaCompressorToNonlinear,
            me->_channelData[cset->idx[0]].chan->width,
            me->_channelData[cset->idx[0]].chan->height);

        if (rv == EXR_ERR_SUCCESS) rv = LossyDctEncoder_execute (&enc);

        *totalAcUncompressedCount = *totalAcUncompressedCount + enc._numAcComp;
        *totalDcUncompressedCount = *totalDcUncompressedCount + enc._numDcComp;

        packedAcEnd += enc._numAcComp * sizeof (uint16_t);
        packedDcEnd += enc._numDcComp * sizeof (uint16_t);

        me->_channelData[cset->idx[0]].processed = 1;
        me->_channelData[cset->idx[1]].processed = 1;
        me->_channelData[cset->idx[2]].processed = 1;

        LossyDctEncoder_destroy (&enc);
        if (rv != EXR_ERR_SUCCESS) return rv;
    }

    for (size_t chan = 0; chan < me->_numChannels; ++chan)
    {
        ChannelData*               cd    = &(me->_channelData[chan]);
        exr_coding_channel_info_t* pchan = cd->chan;

        if (cd->processed) continue;

        switch (cd->compression)
        {
            case LOSSY_DCT:
                //
                // For LOSSY_DCT, treat this just like the CSC'd case,
                // but only operate on one channel
                //
                {
                    LossyDctEncoder       enc;
                    const unsigned short* nonlinearLut = NULL;

                    if (!pchan->p_linear)
                        nonlinearLut = dwaCompressorToNonlinear;

                    rv = LossyDctEncoder_construct (
                        &enc,
                        me->_dwaCompressionLevel / 100000.f,
                        &(cd->_dctData),
                        packedAcEnd,
                        packedDcEnd,
                        nonlinearLut,
                        pchan->width,
                        pchan->height);

                    if (rv == EXR_ERR_SUCCESS)
                        rv = LossyDctEncoder_execute (&enc);

                    *totalAcUncompressedCount =
                        *totalAcUncompressedCount + enc._numAcComp;
                    *totalDcUncompressedCount =
                        *totalDcUncompressedCount + enc._numDcComp;

                    packedAcEnd += enc._numAcComp * sizeof (uint16_t);
                    packedDcEnd += enc._numDcComp * sizeof (uint16_t);

                    LossyDctEncoder_destroy (&enc);
                    if (rv != EXR_ERR_SUCCESS) return rv;
                }
                break;

            case RLE: {
                //
                // For RLE, bash the bytes up so that the first bytes of each
                // pixel are contiguous, as are the second bytes, and so on.
                //
                DctCoderChannelData* dcd = &(cd->_dctData);
                for (size_t y = 0; y < dcd->_size; ++y)
                {
                    const uint8_t* row = dcd->_rows[y];

                    for (int x = 0; x < pchan->width; ++x)
                    {
                        for (int byte = 0; byte < pchan->bytes_per_element;
                             ++byte)
                        {
                            *cd->planarUncRleEnd[byte]++ = *row++;
                        }
                    }

                    *rleRawSize += pchan->width * pchan->bytes_per_element;
                }

                break;
            }

            case UNKNOWN:

                //
                // Otherwise, just copy data over verbatim
                //

                {
                    size_t scanlineSize =
                        pchan->width * pchan->bytes_per_element;
                    DctCoderChannelData* dcd = &(cd->_dctData);
                    for (size_t y = 0; y < dcd->_size; ++y)
                    {
                        memcpy (
                            cd->planarUncBufferEnd,
                            dcd->_rows[y],
                            scanlineSize);

                        cd->planarUncBufferEnd += scanlineSize;
                    }

                    *unknownUncompressedSize += cd->planarUncSize;
                }

                break;

            default: return EXR_ERR_INVALID_ARGUMENT;
        }

        cd->processed = DWA_CLASSIFIER_TRUE;
    }

    //
    // Pack the Unknown data into the output buffer first. Instead of
    // just copying it uncompressed, try zlib compression at least.
    //

    if (*unknownUncompressedSize > 0)
    {
        size_t outSize;

        rv = exr_compress_buffer (
            9, // TODO: use default??? the old call to zlib had 9 hardcoded
            me->_planarUncBuffer[UNKNOWN],
            *unknownUncompressedSize,
            outDataPtr,
            exr_compress_max_buffer_size (*unknownUncompressedSize),
            &outSize);
        if (rv != EXR_ERR_SUCCESS)
        {
            return rv;
            //throw IEX_NAMESPACE::BaseExc ("Data compression (zlib) failed.");
        }

        outDataPtr += outSize;
        *unknownCompressedSize = outSize;
        nWritten += outSize;
    }

    //
    // Now, pack all the Lossy DCT coefficients into our output
    // buffer, with Huffman encoding.
    //
    // Also, record the compressed size and the number of
    // uncompressed componentns we have.
    //

    if (*totalAcUncompressedCount > 0)
    {
        switch (me->_acCompression)
        {
            case STATIC_HUFFMAN: {
                size_t outDataSize =
                    outBufferSize -
                    (size_t) ((uintptr_t) outDataPtr - (uintptr_t) sizes);

                rv = internal_huf_compress (
                    acCompressedSize,
                    outDataPtr,
                    outDataSize,
                    (const uint16_t*) me->_packedAcBuffer,
                    *totalAcUncompressedCount,
                    me->_encode->scratch_buffer_1,
                    me->_encode->scratch_alloc_size_1);
                if (rv != EXR_ERR_SUCCESS)
                {
                    if (rv == EXR_ERR_ARGUMENT_OUT_OF_RANGE)
                    {
                        memcpy (
                            me->_encode->compressed_buffer,
                            me->_encode->packed_buffer,
                            me->_encode->packed_alloc_size);
                        me->_encode->compressed_bytes =
                            me->_encode->packed_alloc_size;
                        return EXR_ERR_SUCCESS;
                    }
                    return rv;
                    //throw IEX_NAMESPACE::InputExc (
                    //    "Data compression (HUF) failed.");
                }
                break;
            }

            case DEFLATE: {
                size_t sourceLen =
                    *totalAcUncompressedCount * sizeof (uint16_t);
                size_t destLen;

                rv = exr_compress_buffer (
                    9, // TODO: use default??? the old call to zlib had 9 hardcoded
                    me->_packedAcBuffer,
                    sourceLen,
                    outDataPtr,
                    exr_compress_max_buffer_size (sourceLen),
                    &destLen);
                if (rv != EXR_ERR_SUCCESS)
                {
                    return rv;
                    //throw IEX_NAMESPACE::InputExc (
                    //    "Data compression (zlib) failed.");
                }

                *acCompressedSize = destLen;
                break;
            }

            default:
                return EXR_ERR_INVALID_ARGUMENT;
                //assert (false);
        }

        outDataPtr += *acCompressedSize;
        nWritten += *acCompressedSize;
    }

    //
    // Handle the DC components separately
    //

    if (*totalDcUncompressedCount > 0)
    {
        size_t compBytes;
        size_t uncompBytes = *totalDcUncompressedCount * sizeof (uint16_t);

        rv = internal_encode_alloc_buffer (
            me->_encode,
            EXR_TRANSCODE_BUFFER_SCRATCH1,
            &(me->_encode->scratch_buffer_1),
            &(me->_encode->scratch_alloc_size_1),
            uncompBytes);

        if (rv != EXR_ERR_SUCCESS) return rv;

        internal_zip_deconstruct_bytes (
            (uint8_t*) me->_encode->scratch_buffer_1,
            (const uint8_t*) me->_packedDcBuffer, uncompBytes);

        rv = exr_compress_buffer (
            me->_zipLevel,
            me->_encode->scratch_buffer_1,
            uncompBytes,
            outDataPtr,
            exr_compress_max_buffer_size (uncompBytes),
            &compBytes);

        if (rv != EXR_ERR_SUCCESS) return rv;

        *dcCompressedSize = compBytes;
        outDataPtr += compBytes;
        nWritten += compBytes;
    }

    //
    // If we have RLE data, first RLE encode it and set the uncompressed
    // size. Then, deflate the results and set the compressed size.
    //

    if (*rleRawSize > 0)
    {
        *rleUncompressedSize = internal_rle_compress (
            me->_rleBuffer,
            me->_rleBufferSize,
            me->_planarUncBuffer[RLE],
            *rleRawSize);

        size_t compBytes;
        rv = exr_compress_buffer (
            9, // TODO: use default??? the old call to zlib had 9 hardcoded
            me->_rleBuffer,
            *rleUncompressedSize,
            outDataPtr,
            exr_compress_max_buffer_size (*rleUncompressedSize),
            &compBytes);

        if (rv != EXR_ERR_SUCCESS) return rv;
        //throw IEX_NAMESPACE::BaseExc ("Error compressing RLE'd data.");

        *rleCompressedSize = compBytes;
        outDataPtr += compBytes;
        nWritten += compBytes;
    }

    //
    // Flip the counters to XDR format
    //
    priv_from_native64 (sizes, NUM_SIZES_SINGLE);

    size_t dataBytes =
        (uintptr_t) outDataPtr - (uintptr_t) me->_encode->compressed_buffer;
    if (nWritten != dataBytes) { return EXR_ERR_CORRUPT_CHUNK; }

    if (nWritten >= me->_encode->packed_bytes)
    {
        memcpy (
            me->_encode->compressed_buffer,
            me->_encode->packed_buffer,
            me->_encode->packed_bytes);
        me->_encode->compressed_bytes = me->_encode->packed_bytes;
    }
    else { me->_encode->compressed_bytes = nWritten; }
    return rv;
}